

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chkhostname.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char local_418 [8];
  char buff [1024];
  char **argv_local;
  int argc_local;
  
  buff._1016_8_ = argv;
  if (argc == 2) {
    iVar1 = Curl_gethostname(local_418,0x400);
    if (iVar1 == 0) {
      iVar1 = strncmp(local_418,*(char **)(buff._1016_8_ + 8),0x400);
      if (iVar1 == 0) {
        argv_local._4_4_ = 0;
      }
      else {
        printf("got unexpected host name back, LD_PRELOAD failed\n");
        argv_local._4_4_ = 1;
      }
    }
    else {
      printf("Curl_gethostname() failed\n");
      argv_local._4_4_ = 1;
    }
  }
  else {
    printf("Usage: %s EXPECTED_HOSTNAME\n",*argv);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
  char buff[HOSTNAME_MAX];
  if(argc != 2) {
    printf("Usage: %s EXPECTED_HOSTNAME\n", argv[0]);
    return 1;
  }

  if(Curl_gethostname(buff, HOSTNAME_MAX)) {
    printf("Curl_gethostname() failed\n");
    return 1;
  }

  /* compare the name returned by Curl_gethostname() with the expected one */
  if(strncmp(buff, argv[1], HOSTNAME_MAX)) {
    printf("got unexpected host name back, LD_PRELOAD failed\n");
    return 1;
  }
  return 0;
}